

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCubeEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"zvh"), iVar3 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) {
      if (bVar1) {
        Abc_EnumerateCubeStatesZdd();
        return 0;
      }
      Abc_EnumerateCubeStates();
      return 0;
    }
    if (iVar3 == 0x68) goto LAB_0023a304;
    if (iVar3 != 0x7a) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"Unknown switch.\n");
LAB_0023a304:
  Abc_Print(-2,"usage: cubeenum [-vh]\n");
  Abc_Print(-2,"\t         enumerates reachable states of 2x2x2 cube\n");
  Abc_Print(-2,"\t         (http://en.wikipedia.org/wiki/Pocket_Cube)\n");
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-z     : toggle using ZDD-based algorithm [default = %s]\n",pcVar4);
  if (!bVar2) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandCubeEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_EnumerateCubeStates();
    extern void Abc_EnumerateCubeStatesZdd();
    int c, fZddAlgo = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "zvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'z':
            fZddAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( fZddAlgo )
        Abc_EnumerateCubeStatesZdd();
    else
        Abc_EnumerateCubeStates();
    return 0;

usage:
    Abc_Print( -2, "usage: cubeenum [-vh]\n" );
    Abc_Print( -2, "\t         enumerates reachable states of 2x2x2 cube\n" );
    Abc_Print( -2, "\t         (http://en.wikipedia.org/wiki/Pocket_Cube)\n" );
    Abc_Print( -2, "\t-z     : toggle using ZDD-based algorithm [default = %s]\n", fZddAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}